

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
CoreML::FeatureType::toDictionary_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,FeatureType *this)

{
  bool bVar1;
  ArrayFeatureType_ArrayDataType AVar2;
  ShapeFlexibilityCase SVar3;
  KeyTypeCase KVar4;
  ImageFeatureType_ColorSpace IVar5;
  SizeFlexibilityCase SVar6;
  TypeCase TVar7;
  element_type *peVar8;
  mapped_type *pmVar9;
  DictionaryFeatureType *this_00;
  reference pvVar10;
  SizeRange *pSVar11;
  CoreML *this_01;
  int64 min;
  undefined1 useArrayFormat;
  TypeCase tag_00;
  ArrayFeatureType_ArrayDataType dataType;
  KeyTypeCase tag_01;
  ImageFeatureType_ColorSpace colorspace;
  TypeCase seqType;
  undefined1 in_R8B;
  char *local_818;
  char *local_7f0;
  char *local_6f0;
  char *local_680;
  allocator<char> local_639;
  key_type local_638;
  string local_618;
  allocator<char> local_5f1;
  key_type local_5f0;
  string local_5d0;
  SequenceFeatureType *local_5b0;
  SequenceFeatureType *params_2;
  key_type local_5a0;
  string local_580;
  allocator<char> local_559;
  key_type local_558;
  string local_538;
  undefined1 local_518 [8];
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> ranges_1;
  key_type local_4f8;
  string local_4d8;
  allocator<char> local_4b1;
  key_type local_4b0;
  string local_490;
  undefined1 local_470 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  shapes_1;
  key_type local_450;
  allocator<char> local_429;
  key_type local_428;
  allocator<char> local_401;
  key_type local_400;
  string local_3e0;
  allocator<char> local_3b9;
  key_type local_3b8;
  string local_398;
  allocator<char> local_371;
  key_type local_370;
  string local_350;
  undefined1 local_330 [8];
  vector<long,_std::allocator<long>_> defaultSize;
  ImageFeatureType *params_1;
  key_type local_308;
  string local_2e8;
  allocator<char> local_2c1;
  key_type local_2c0;
  string local_2a0;
  allocator<char> local_279;
  key_type local_278;
  string local_258;
  undefined1 local_238 [8];
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> ranges;
  key_type local_218;
  string local_1f8;
  allocator<char> local_1d1;
  key_type local_1d0;
  string local_1b0;
  undefined1 local_190 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  shapes;
  key_type local_170;
  allocator<char> local_149;
  key_type local_148;
  vector<long,_std::allocator<long>_> local_128;
  string local_110;
  allocator<char> local_e9;
  key_type local_e8;
  string local_c8;
  ArrayFeatureType *local_a8;
  ArrayFeatureType *params;
  key_type local_98;
  allocator<char> local_71;
  key_type local_70;
  string local_40;
  undefined1 local_1d;
  TypeCase local_1c;
  FeatureType *pFStack_18;
  TypeCase tag;
  FeatureType *this_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *dict;
  
  pFStack_18 = this;
  this_local = (FeatureType *)__return_storage_ptr__;
  peVar8 = std::
           __shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  local_1c = Specification::FeatureType::Type_case(peVar8);
  local_1d = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(__return_storage_ptr__);
  featureTypeToString_abi_cxx11_(&local_40,(CoreML *)(ulong)local_1c,tag_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"type",&local_71);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](__return_storage_ptr__,&local_70);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_40);
  peVar8 = std::
           __shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  bVar1 = Specification::FeatureType::isoptional(peVar8);
  if (bVar1) {
    local_680 = "1";
  }
  else {
    local_680 = "0";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"isOptional",(allocator<char> *)((long)&params + 7));
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](__return_storage_ptr__,&local_98);
  std::__cxx11::string::operator=((string *)pmVar9,local_680);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)((long)&params + 7));
  useArrayFormat = 0x60;
  switch(local_1c) {
  case kImageType:
    peVar8 = std::
             __shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    defaultSize.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)Specification::FeatureType::imagetype(peVar8);
    defaultSizeOf((vector<long,_std::allocator<long>_> *)local_330,
                  (ImageFeatureType *)
                  defaultSize.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    pvVar10 = std::vector<long,_std::allocator<long>_>::operator[]
                        ((vector<long,_std::allocator<long>_> *)local_330,0);
    std::__cxx11::to_string(&local_350,*pvVar10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"width",&local_371);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](__return_storage_ptr__,&local_370);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_350);
    std::__cxx11::string::~string((string *)&local_370);
    std::allocator<char>::~allocator(&local_371);
    std::__cxx11::string::~string((string *)&local_350);
    pvVar10 = std::vector<long,_std::allocator<long>_>::operator[]
                        ((vector<long,_std::allocator<long>_> *)local_330,1);
    std::__cxx11::to_string(&local_398,*pvVar10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"height",&local_3b9);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](__return_storage_ptr__,&local_3b8);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_398);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator(&local_3b9);
    std::__cxx11::string::~string((string *)&local_398);
    IVar5 = Specification::ImageFeatureType::colorspace
                      ((ImageFeatureType *)
                       defaultSize.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    colorSpaceToString_abi_cxx11_(&local_3e0,(CoreML *)(ulong)(uint)IVar5,colorspace);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"colorspace",&local_401)
    ;
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](__return_storage_ptr__,&local_400);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_400);
    std::allocator<char>::~allocator(&local_401);
    std::__cxx11::string::~string((string *)&local_3e0);
    IVar5 = Specification::ImageFeatureType::colorspace
                      ((ImageFeatureType *)
                       defaultSize.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    if ((IVar5 == ImageFeatureType_ColorSpace_GRAYSCALE) ||
       (IVar5 = Specification::ImageFeatureType::colorspace
                          ((ImageFeatureType *)
                           defaultSize.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage),
       IVar5 == ImageFeatureType_ColorSpace_GRAYSCALE_FLOAT16)) {
      local_7f0 = "0";
    }
    else {
      local_7f0 = "1";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"isColor",&local_429);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](__return_storage_ptr__,&local_428);
    std::__cxx11::string::operator=((string *)pmVar9,local_7f0);
    std::__cxx11::string::~string((string *)&local_428);
    std::allocator<char>::~allocator(&local_429);
    SVar6 = Specification::ImageFeatureType::SizeFlexibility_case
                      ((ImageFeatureType *)
                       defaultSize.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    if (SVar6 == SIZEFLEXIBILITY_NOT_SET) {
      local_818 = "0";
    }
    else {
      local_818 = "1";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_450,"hasSizeFlexibility",
               (allocator<char> *)
               ((long)&shapes_1.
                       super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](__return_storage_ptr__,&local_450);
    std::__cxx11::string::operator=((string *)pmVar9,local_818);
    std::__cxx11::string::~string((string *)&local_450);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&shapes_1.
                       super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    SVar6 = Specification::ImageFeatureType::SizeFlexibility_case
                      ((ImageFeatureType *)
                       defaultSize.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    if (SVar6 != SIZEFLEXIBILITY_NOT_SET) {
      if (SVar6 == kEnumeratedSizes) {
        enumeratedSizesOf((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                           *)local_470,
                          (ImageFeatureType *)
                          defaultSize.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
        enumeratedShapesToString_abi_cxx11_
                  (&local_490,(CoreML *)local_470,
                   (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    *)0x1,(bool)useArrayFormat);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4b0,"enumeratedSizes",&local_4b1);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](__return_storage_ptr__,&local_4b0);
        std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_490);
        std::__cxx11::string::~string((string *)&local_4b0);
        std::allocator<char>::~allocator(&local_4b1);
        std::__cxx11::string::~string((string *)&local_490);
        enumeratedShapesToString_abi_cxx11_
                  (&local_4d8,(CoreML *)local_470,
                   (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    *)0x0,(bool)useArrayFormat);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4f8,"sizeFlexibility",
                   (allocator<char> *)
                   ((long)&ranges_1.
                           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](__return_storage_ptr__,&local_4f8);
        std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_4d8);
        std::__cxx11::string::~string((string *)&local_4f8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&ranges_1.
                           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::__cxx11::string::~string((string *)&local_4d8);
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   *)local_470);
      }
      else if (SVar6 == kImageSizeRange) {
        sizeRangesOf((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                     local_518,
                     (ImageFeatureType *)
                     defaultSize.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
        dimensionRangesToString_abi_cxx11_
                  (&local_538,(CoreML *)local_518,
                   (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)0x1,
                   (bool)useArrayFormat);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_558,"sizeRange",&local_559);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](__return_storage_ptr__,&local_558);
        std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_538);
        std::__cxx11::string::~string((string *)&local_558);
        std::allocator<char>::~allocator(&local_559);
        std::__cxx11::string::~string((string *)&local_538);
        dimensionRangesToString_abi_cxx11_
                  (&local_580,(CoreML *)local_518,
                   (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)0x0,
                   (bool)useArrayFormat);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5a0,"sizeFlexibility",(allocator<char> *)((long)&params_2 + 7));
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](__return_storage_ptr__,&local_5a0);
        std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_580);
        std::__cxx11::string::~string((string *)&local_5a0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&params_2 + 7));
        std::__cxx11::string::~string((string *)&local_580);
        std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~vector
                  ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                   local_518);
      }
    }
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)local_330);
    break;
  case kMultiArrayType:
    peVar8 = std::
             __shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    local_a8 = Specification::FeatureType::multiarraytype(peVar8);
    AVar2 = Specification::ArrayFeatureType::datatype(local_a8);
    dataTypeToString_abi_cxx11_(&local_c8,(CoreML *)(ulong)(uint)AVar2,dataType);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"dataType",&local_e9);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](__return_storage_ptr__,&local_e8);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    std::__cxx11::string::~string((string *)&local_c8);
    defaultShapeOf(&local_128,local_a8);
    dimensionsToString_abi_cxx11_
              (&local_110,(CoreML *)&local_128,(vector<long,_std::allocator<long>_> *)0x1,
               (bool)useArrayFormat);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"shape",&local_149);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](__return_storage_ptr__,&local_148);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator(&local_149);
    std::__cxx11::string::~string((string *)&local_110);
    std::vector<long,_std::allocator<long>_>::~vector(&local_128);
    SVar3 = Specification::ArrayFeatureType::ShapeFlexibility_case(local_a8);
    if (SVar3 == SHAPEFLEXIBILITY_NOT_SET) {
      local_6f0 = "0";
    }
    else {
      local_6f0 = "1";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"hasShapeFlexibility",
               (allocator<char> *)
               ((long)&shapes.
                       super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](__return_storage_ptr__,&local_170);
    std::__cxx11::string::operator=((string *)pmVar9,local_6f0);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&shapes.
                       super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    SVar3 = Specification::ArrayFeatureType::ShapeFlexibility_case(local_a8);
    if (SVar3 != SHAPEFLEXIBILITY_NOT_SET) {
      if (SVar3 == kEnumeratedShapes) {
        enumeratedShapesOf((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                            *)local_190,local_a8);
        enumeratedShapesToString_abi_cxx11_
                  (&local_1b0,(CoreML *)local_190,
                   (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    *)0x1,(bool)useArrayFormat);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d0,"enumeratedShapes",&local_1d1);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](__return_storage_ptr__,&local_1d0);
        std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::allocator<char>::~allocator(&local_1d1);
        std::__cxx11::string::~string((string *)&local_1b0);
        enumeratedShapesToString_abi_cxx11_
                  (&local_1f8,(CoreML *)local_190,
                   (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    *)0x0,(bool)useArrayFormat);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_218,"shapeFlexibility",
                   (allocator<char> *)
                   ((long)&ranges.
                           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](__return_storage_ptr__,&local_218);
        std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_218);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&ranges.
                           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::__cxx11::string::~string((string *)&local_1f8);
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   *)local_190);
      }
      else if (SVar3 == kShapeRange) {
        shapeRangesOf((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                      local_238,local_a8);
        dimensionRangesToString_abi_cxx11_
                  (&local_258,(CoreML *)local_238,
                   (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)0x1,
                   (bool)useArrayFormat);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_278,"shapeRange",&local_279);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](__return_storage_ptr__,&local_278);
        std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_258);
        std::__cxx11::string::~string((string *)&local_278);
        std::allocator<char>::~allocator(&local_279);
        std::__cxx11::string::~string((string *)&local_258);
        dimensionRangesToString_abi_cxx11_
                  (&local_2a0,(CoreML *)local_238,
                   (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)0x0,
                   (bool)useArrayFormat);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2c0,"shapeFlexibility",&local_2c1);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](__return_storage_ptr__,&local_2c0);
        std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_2a0);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::allocator<char>::~allocator(&local_2c1);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~vector
                  ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                   local_238);
      }
    }
    break;
  case kDictionaryType:
    peVar8 = std::
             __shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    this_00 = Specification::FeatureType::dictionarytype(peVar8);
    KVar4 = Specification::DictionaryFeatureType::KeyType_case(this_00);
    keyTypeToString_abi_cxx11_(&local_2e8,(CoreML *)(ulong)KVar4,tag_01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_308,"keyType",(allocator<char> *)((long)&params_1 + 7));
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](__return_storage_ptr__,&local_308);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_308);
    std::allocator<char>::~allocator((allocator<char> *)((long)&params_1 + 7));
    std::__cxx11::string::~string((string *)&local_2e8);
    break;
  case kSequenceType:
    peVar8 = std::
             __shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    local_5b0 = Specification::FeatureType::sequencetype(peVar8);
    TVar7 = Specification::SequenceFeatureType::Type_case(local_5b0);
    sequenceTypeToString_abi_cxx11_(&local_5d0,(CoreML *)(ulong)TVar7,seqType);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f0,"valueType",&local_5f1);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](__return_storage_ptr__,&local_5f0);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_5d0);
    std::__cxx11::string::~string((string *)&local_5f0);
    std::allocator<char>::~allocator(&local_5f1);
    std::__cxx11::string::~string((string *)&local_5d0);
    pSVar11 = Specification::SequenceFeatureType::sizerange(local_5b0);
    this_01 = (CoreML *)Specification::SizeRange::lowerbound(pSVar11);
    pSVar11 = Specification::SequenceFeatureType::sizerange(local_5b0);
    min = Specification::SizeRange::upperbound(pSVar11);
    rangeToString_abi_cxx11_(&local_618,this_01,min,1,(bool)in_R8B);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_638,"sizeRange",&local_639);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](__return_storage_ptr__,&local_638);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_618);
    std::__cxx11::string::~string((string *)&local_638);
    std::allocator<char>::~allocator(&local_639);
    std::__cxx11::string::~string((string *)&local_618);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string,std::string> FeatureType::toDictionary() const {
        Specification::FeatureType::TypeCase tag = m_type->Type_case();

        std::map<std::string, std::string> dict;
        dict["type"] = featureTypeToString(tag);
        dict["isOptional"] = m_type->isoptional() ? "1" : "0";

        switch (tag) {
            case Specification::FeatureType::kMultiArrayType:
            {
                const Specification::ArrayFeatureType& params = m_type->multiarraytype();
                dict["dataType"] = dataTypeToString(params.datatype());
                dict["shape"] = dimensionsToString(defaultShapeOf(params),true);
                dict["hasShapeFlexibility"] = params.ShapeFlexibility_case() != Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET ? "1" : "0";
                switch (params.ShapeFlexibility_case()) {
                    case Specification::ArrayFeatureType::kEnumeratedShapes: {
                        std::vector<std::vector<int64_t>> shapes = enumeratedShapesOf(params);
                        dict["enumeratedShapes"] = enumeratedShapesToString(shapes,true);
                        dict["shapeFlexibility"] = enumeratedShapesToString(shapes,false);
                        break;
                    }
                    case Specification::ArrayFeatureType::kShapeRange: {
                        std::vector<std::pair<int64_t,int64_t>> ranges = shapeRangesOf(params);
                        dict["shapeRange"] = dimensionRangesToString(ranges,true);
                        dict["shapeFlexibility"] = dimensionRangesToString(ranges,false);
                        break;
                    }
                    case Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                        break;
                }
                break;
            }
            case Specification::FeatureType::kDictionaryType:
            {
                dict["keyType"] = keyTypeToString(m_type->dictionarytype().KeyType_case());
                break;
            }
            case Specification::FeatureType::kImageType:
            {
                const Specification::ImageFeatureType& params = m_type->imagetype();
                auto defaultSize = defaultSizeOf(params);
                dict["width"] = std::to_string(defaultSize[0]);
                dict["height"] = std::to_string(defaultSize[1]);
                dict["colorspace"] = colorSpaceToString(params.colorspace());
                dict["isColor"] = (params.colorspace() == Specification::ImageFeatureType_ColorSpace_GRAYSCALE ||
                                   params.colorspace() == Specification::ImageFeatureType_ColorSpace_GRAYSCALE_FLOAT16) ? "0" : "1";
                dict["hasSizeFlexibility"] = params.SizeFlexibility_case() != Specification::ImageFeatureType::SIZEFLEXIBILITY_NOT_SET ? "1" : "0";
                switch (params.SizeFlexibility_case()) {
                    case Specification::ImageFeatureType::kEnumeratedSizes: {
                        std::vector<std::vector<int64_t>> shapes = enumeratedSizesOf(params);
                        dict["enumeratedSizes"] = enumeratedShapesToString(shapes,true);
                        dict["sizeFlexibility"] = enumeratedShapesToString(shapes,false);
                        break;
                    }
                    case Specification::ImageFeatureType::kImageSizeRange: {
                        std::vector<std::pair<int64_t,int64_t>> ranges = sizeRangesOf(params);
                        dict["sizeRange"] = dimensionRangesToString(ranges,true);
                        dict["sizeFlexibility"] = dimensionRangesToString(ranges,false);
                        break;
                    }
                    case Specification::ImageFeatureType::SIZEFLEXIBILITY_NOT_SET:
                        break;
                }
                break;
            }
            case Specification::FeatureType::kSequenceType:
            {
                const Specification::SequenceFeatureType& params = m_type->sequencetype();
                dict["valueType"] = sequenceTypeToString(params.Type_case());
                dict["sizeRange"] = rangeToString((int64_t)params.sizerange().lowerbound(), params.sizerange().upperbound(),true);
                break;
            }
            default:
                break;
        }

        return dict;
    }